

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O0

int __thiscall n_pca::NPca::detector(NPca *this,u_char *image_data)

{
  byte bVar1;
  int iVar2;
  Scalar *pSVar3;
  long lVar4;
  Index IVar5;
  reference pvVar6;
  RowXpr local_220;
  RowXpr local_1e8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  local_1b0;
  RealScalar local_138;
  double difference;
  RealScalar RStack_128;
  int i_1;
  double min_difference;
  undefined1 auStack_118 [4];
  int match_index;
  RhsNested local_110;
  undefined1 local_108 [8];
  MatrixXd detector_data_matrix;
  RowXpr local_b8;
  undefined1 local_80 [8];
  MatrixXd detector_zero_matrix;
  int local_54;
  undefined1 local_50 [4];
  int i;
  undefined1 local_38 [8];
  MatrixXd detector_matrix;
  int size;
  u_char *image_data_local;
  NPca *this_local;
  
  detector_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
  _4_4_ = this->n_config_->image_height_ * this->n_config_->image_width_;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)local_50,1,
             (long)detector_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols._4_4_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_38,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_50);
  for (local_54 = 0;
      local_54 <
      detector_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols._4_4_; local_54 = local_54 + 1) {
    bVar1 = image_data[local_54];
    pSVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_38,0,
                        (long)local_54);
    *pSVar3 = (double)bVar1;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_80,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_38);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_b8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->train_mean_,0)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((RowXpr *)
             &detector_data_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
             &detector_data_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             &local_b8);
  _auStack_118 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_80,
                            (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                            &this->basic_matrix_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_108,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)auStack_118);
  min_difference._4_4_ = 0;
  RStack_128 = -1.0;
  difference._4_4_ = 0;
  while( true ) {
    lVar4 = (long)difference._4_4_;
    IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&(this->train_data_matrix_).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar5 <= lVar4) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_1e8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_108,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_220,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->train_data_matrix_,
               (long)difference._4_4_);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator-
              (&local_1b0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
               &local_1e8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_220);
    local_138 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
                ::squaredNorm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                               *)&local_1b0);
    if ((RStack_128 < 0.0) || (local_138 < RStack_128)) {
      min_difference._4_4_ = difference._4_4_;
      RStack_128 = local_138;
    }
    difference._4_4_ = difference._4_4_ + 1;
  }
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->train_label_,(long)min_difference._4_4_);
  iVar2 = *pvVar6;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_108);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_38);
  return iVar2;
}

Assistant:

int NPca::detector(u_char* image_data)
{
    int size = n_config_->image_height_ * n_config_->image_width_;  
    MatrixXd detector_matrix = MatrixXd::Zero(1, size);

    for (int i = 0; i < size; i++)
        detector_matrix.coeffRef(0, i) = image_data[i];

    MatrixXd detector_zero_matrix = detector_matrix;

    detector_zero_matrix.row(0) -= train_mean_.row(0);

    MatrixXd detector_data_matrix = detector_zero_matrix * basic_matrix_;
    int match_index = 0;
    double min_difference = -1;
    for (int i = 0; i < train_data_matrix_.rows(); i++)
    {
        double difference = (detector_data_matrix.row(0) - train_data_matrix_.row(i)).squaredNorm();
        if (min_difference < 0 || min_difference > difference)
        {
            min_difference = difference;
            match_index = i;
        }
    }

    return train_label_[match_index];
}